

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode *node)

{
  byte bVar1;
  ImGuiDockNode *pIVar2;
  ImGuiWindow *window;
  bool bVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  pIVar4 = GImGui;
  pIVar2 = node->ParentNode;
  if (pIVar2 != (ImGuiDockNode *)0x0) {
    if ((pIVar2->ChildNodes[0] != node) && (pIVar2->ChildNodes[1] != node)) {
      __assert_fail("node->ParentNode == __null || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x35c1,"void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode *)");
    }
    if (pIVar2 != (ImGuiDockNode *)0x0) {
      node->SharedFlags = pIVar2->SharedFlags;
    }
  }
  node->field_0xbd = node->field_0xbd & 0xdf;
  if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateFlagsAndCollapse(node->ChildNodes[0]);
  }
  if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
    DockNodeUpdateFlagsAndCollapse(node->ChildNodes[1]);
  }
  node->LocalFlagsInWindows = 0;
  if (0 < (node->Windows).Size) {
    uVar6 = 0;
    do {
      if ((int)uVar6 < 0) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      window = (node->Windows).Data[uVar6];
      if (window->DockNode != node) {
        __assert_fail("window->DockNode == node",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x35d7,"void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode *)");
      }
      bVar3 = false;
      bVar8 = false;
      if ((node->LastFrameActive + 1 == pIVar4->FrameCount) &&
         (((bVar3 = window->LastFrameActive + 1 < pIVar4->FrameCount, bVar8 = false,
           (node->field_0xbd & 0x40) != 0 || (node->WantCloseTabId == window->ID)) &&
          (window->HasCloseButton == true)))) {
        bVar8 = (window->Flags & 0x100000) == 0;
      }
      if ((bVar8 || bVar3) || ((byte)window->field_0x3e1 >> 3 & 1) != 0) {
        window->field_0x3e1 = window->field_0x3e1 & 0xf7;
        if (((node->Windows).Size == 1) && ((node->MergedFlags & 0x800) == 0)) {
          DockNodeHideHostWindow(node);
          node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
          DockNodeRemoveWindow(node,window,node->ID);
          bVar3 = true;
        }
        else {
          DockNodeRemoveWindow(node,window,node->ID);
          uVar6 = uVar6 - 1;
          bVar3 = false;
        }
      }
      else {
        node->LocalFlagsInWindows =
             node->LocalFlagsInWindows | (window->WindowClass).DockNodeFlagsOverrideSet;
        bVar3 = false;
      }
      if (bVar3) {
        return;
      }
      uVar6 = uVar6 + 1;
    } while ((int)uVar6 < (node->Windows).Size);
  }
  uVar6 = node->LocalFlags;
  uVar5 = node->SharedFlags | node->LocalFlagsInWindows;
  uVar7 = uVar5 | uVar6;
  node->MergedFlags = uVar7;
  if ((((node->field_0xbe & 2) != 0) && ((node->Windows).Size == 1)) && ((uVar7 & 0x2040) == 0x40))
  {
    node->field_0xbe = node->field_0xbe | 4;
  }
  bVar1 = node->field_0xbe;
  node->field_0xbe = bVar1 & 0xfd;
  if ((((bVar1 & 4) != 0) && (node->VisibleWindow != (ImGuiWindow *)0x0)) &&
     (((node->VisibleWindow->WindowClass).DockNodeFlagsOverrideSet & 0x2000) != 0)) {
    node->field_0xbe = bVar1 & 0xf9;
  }
  if ((node->Windows).Size < 2) {
    if ((node->field_0xbe & 4) == 0) goto LAB_0014dc6e;
    uVar6 = uVar6 ^ 0x2000;
  }
  else {
    uVar6 = uVar6 & 0xffffdfff;
  }
  node->LocalFlags = uVar6;
  node->MergedFlags = uVar5 | uVar6;
LAB_0014dc6e:
  node->field_0xbe = node->field_0xbe & 0xfb;
  DockNodeUpdateVisibleFlag(node);
  return;
}

Assistant:

static void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->ParentNode == NULL || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node);

    // Inherit most flags
    if (node->ParentNode)
        node->SharedFlags = node->ParentNode->SharedFlags & ImGuiDockNodeFlags_SharedFlagsInheritMask_;

    // Recurse into children
    // There is the possibility that one of our child becoming empty will delete itself and moving its sibling contents into 'node'.
    // If 'node->ChildNode[0]' delete itself, then 'node->ChildNode[1]->Windows' will be moved into 'node'
    // If 'node->ChildNode[1]' delete itself, then 'node->ChildNode[0]->Windows' will be moved into 'node' and the "remove inactive windows" loop will have run twice on those windows (harmless)
    node->HasCentralNodeChild = false;
    if (node->ChildNodes[0])
        DockNodeUpdateFlagsAndCollapse(node->ChildNodes[0]);
    if (node->ChildNodes[1])
        DockNodeUpdateFlagsAndCollapse(node->ChildNodes[1]);

    // Remove inactive windows, collapse nodes
    // Merge node flags overrides stored in windows
    node->LocalFlagsInWindows = ImGuiDockNodeFlags_None;
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        ImGuiWindow* window = node->Windows[window_n];
        IM_ASSERT(window->DockNode == node);

        bool node_was_active = (node->LastFrameActive + 1 == g.FrameCount);
        bool remove = false;
        remove |= node_was_active && (window->LastFrameActive + 1 < g.FrameCount);
        remove |= node_was_active && (node->WantCloseAll || node->WantCloseTabId == window->ID) && window->HasCloseButton && !(window->Flags & ImGuiWindowFlags_UnsavedDocument);  // Submit all _expected_ closure from last frame
        remove |= (window->DockTabWantClose);
        if (remove)
        {
            window->DockTabWantClose = false;
            if (node->Windows.Size == 1 && !node->IsCentralNode())
            {
                DockNodeHideHostWindow(node);
                node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
                DockNodeRemoveWindow(node, window, node->ID); // Will delete the node so it'll be invalid on return
                return;
            }
            DockNodeRemoveWindow(node, window, node->ID);
            window_n--;
            continue;
        }

        // FIXME-DOCKING: Missing policies for conflict resolution, hence the "Experimental" tag on this.
        //node->LocalFlagsInWindow &= ~window->WindowClass.DockNodeFlagsOverrideClear;
        node->LocalFlagsInWindows |= window->WindowClass.DockNodeFlagsOverrideSet;
    }
    node->UpdateMergedFlags();

    // Auto-hide tab bar option
    ImGuiDockNodeFlags node_flags = node->MergedFlags;
    if (node->WantHiddenTabBarUpdate && node->Windows.Size == 1 && (node_flags & ImGuiDockNodeFlags_AutoHideTabBar) && !node->IsHiddenTabBar())
        node->WantHiddenTabBarToggle = true;
    node->WantHiddenTabBarUpdate = false;

    // Cancel toggling if we know our tab bar is enforced to be hidden at all times
    if (node->WantHiddenTabBarToggle && node->VisibleWindow && (node->VisibleWindow->WindowClass.DockNodeFlagsOverrideSet & ImGuiDockNodeFlags_HiddenTabBar))
        node->WantHiddenTabBarToggle = false;

    // Apply toggles at a single point of the frame (here!)
    if (node->Windows.Size > 1)
        node->SetLocalFlags(node->LocalFlags & ~ImGuiDockNodeFlags_HiddenTabBar);
    else if (node->WantHiddenTabBarToggle)
        node->SetLocalFlags(node->LocalFlags ^ ImGuiDockNodeFlags_HiddenTabBar);
    node->WantHiddenTabBarToggle = false;

    DockNodeUpdateVisibleFlag(node);
}